

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

Int64FeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::mutable_int64keytype(DictionaryFeatureType *this)

{
  bool bVar1;
  Int64FeatureType *this_00;
  DictionaryFeatureType *this_local;
  
  bVar1 = has_int64keytype(this);
  if (!bVar1) {
    clear_KeyType(this);
    set_has_int64keytype(this);
    this_00 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_00);
    (this->KeyType_).int64keytype_ = this_00;
  }
  return (this->KeyType_).int64keytype_;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* DictionaryFeatureType::mutable_int64keytype() {
  if (!has_int64keytype()) {
    clear_KeyType();
    set_has_int64keytype();
    KeyType_.int64keytype_ = new ::CoreML::Specification::Int64FeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictionaryFeatureType.int64KeyType)
  return KeyType_.int64keytype_;
}